

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcPrsMem::delete_all(CTcPrsMem *this)

{
  long lVar1;
  long *in_RDI;
  tcprsmem_blk_t *nxt;
  
  while (*in_RDI != 0) {
    lVar1 = *(long *)*in_RDI;
    free((void *)*in_RDI);
    *in_RDI = lVar1;
  }
  in_RDI[1] = 0;
  return;
}

Assistant:

void CTcPrsMem::delete_all()
{
    /* free all blocks */
    while (head_ != 0)
    {
        tcprsmem_blk_t *nxt;

        /* remember the next block after this one */
        nxt = head_->next_;

        /* free this block */
        t3free(head_);

        /* move on to the next one */
        head_ = nxt;
    }

    /* there's no tail now */
    tail_ = 0;
}